

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

void __thiscall
tsbp::LeftmostActiveOnly::DomainReductionY(LeftmostActiveOnly *this,size_t domainReducedItemIndex)

{
  int iVar1;
  Rectangle *pRVar2;
  size_type __n;
  reference pvVar3;
  Rectangle *pRVar4;
  reference pvVar5;
  double dVar6;
  allocator<unsigned_long> local_a1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  reference local_80;
  value_type *bitsetY;
  size_t j;
  allocator<unsigned_long> local_59;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  reference local_38;
  value_type *bitsetY_1;
  Rectangle *item;
  size_t i;
  int reducedDomainThresholdY;
  int reducedDomainThresholdX;
  size_t domainReducedItemIndex_local;
  LeftmostActiveOnly *this_local;
  
  _reducedDomainThresholdY = (Rectangle *)domainReducedItemIndex;
  domainReducedItemIndex_local = (size_t)this;
  __n = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve(&this->itemSpecificPlacementPointsY,__n);
  iVar1 = (this->container).super_Rectangle.Dx;
  pvVar3 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                     (&this->items,(size_type)_reducedDomainThresholdY);
  dVar6 = floor((double)(iVar1 - pvVar3->Dx) / 2.0);
  i._4_4_ = (int)dVar6;
  iVar1 = (this->container).super_Rectangle.Dy;
  pvVar3 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                     (&this->items,(size_type)_reducedDomainThresholdY);
  dVar6 = floor((double)(iVar1 - pvVar3->Dy) / 2.0);
  i._0_4_ = (int)dVar6;
  item = (Rectangle *)0x0;
  while( true ) {
    pRVar2 = item;
    pRVar4 = (Rectangle *)
             std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
    if (pRVar4 <= pRVar2) {
      return;
    }
    bitsetY_1 = (value_type *)
                std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                          (&this->items,(size_type)item);
    if ((Rectangle *)(long)((reference)bitsetY_1)->InternId != item) break;
    if (item == _reducedDomainThresholdY) {
      iVar1 = (this->container).super_Rectangle.Dy;
      std::allocator<unsigned_long>::allocator(&local_59);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_58,(long)iVar1,0,&local_59);
      pvVar5 = std::
               vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
               ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                         ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                           *)&this->itemSpecificPlacementPointsY,&local_58);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&local_58);
      std::allocator<unsigned_long>::~allocator(&local_59);
      local_38 = pvVar5;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(pvVar5);
      for (bitsetY = (value_type *)0x0; bitsetY <= (value_type *)(long)(int)i;
          bitsetY = (value_type *)
                    ((long)&(bitsetY->m_bits).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1)) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (local_38,(size_type)bitsetY,true);
      }
      this->reducedItemDomainX = (long)i._4_4_;
      this->reducedItemDomainY = (long)(int)i;
      this->reducedItemFeasiblePlacementPoints = (long)((i._4_4_ + 1) * ((int)i + 1));
    }
    else {
      iVar1 = (this->container).super_Rectangle.Dy;
      std::allocator<unsigned_long>::allocator(&local_a1);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_a0,(long)iVar1,0,&local_a1);
      pvVar5 = std::
               vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
               ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                         ((vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                           *)&this->itemSpecificPlacementPointsY,&local_a0);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&local_a0);
      std::allocator<unsigned_long>::~allocator(&local_a1);
      local_80 = pvVar5;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar5);
    }
    item = (Rectangle *)((long)&item->X + 1);
  }
  __assert_fail("item.InternId == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp"
                ,0x83,"void tsbp::LeftmostActiveOnly::DomainReductionY(const size_t)");
}

Assistant:

void LeftmostActiveOnly::DomainReductionY(const size_t domainReducedItemIndex)
{
    itemSpecificPlacementPointsY.reserve(this->items.size());

    int reducedDomainThresholdX = std::floor((this->container.Dx - this->items[domainReducedItemIndex].Dx) / 2.0);
    int reducedDomainThresholdY = std::floor((this->container.Dy - this->items[domainReducedItemIndex].Dy) / 2.0);

    for (size_t i = 0; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];
        assert(item.InternId == i);

        if (i == domainReducedItemIndex)
        {
            auto& bitsetY = this->itemSpecificPlacementPointsY.emplace_back(boost::dynamic_bitset<>(this->container.Dy));
            bitsetY.reset();

            for (size_t j = 0; j <= reducedDomainThresholdY; j++)
            {
                bitsetY.set(j);
            }

            this->reducedItemDomainX = reducedDomainThresholdX;
            this->reducedItemDomainY = reducedDomainThresholdY;
            this->reducedItemFeasiblePlacementPoints = (reducedDomainThresholdX + 1) * (reducedDomainThresholdY + 1);

            continue;
        }

        // TODO: reduce by item.Dy to exclude overlap with the container. Enables simplification of no-overlap checks.
        auto& bitsetY = this->itemSpecificPlacementPointsY.emplace_back(boost::dynamic_bitset<>(this->container.Dy));
        bitsetY.set();
    }
}